

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

Node * __thiscall
leveldb::SkipList<unsigned_long,_leveldb::Comparator>::FindLessThan
          (SkipList<unsigned_long,_leveldb::Comparator> *this,unsigned_long *key)

{
  int iVar1;
  Node *a;
  bool bVar2;
  Node *next;
  Node *pNStack_20;
  int level;
  Node *x;
  unsigned_long *key_local;
  SkipList<unsigned_long,_leveldb::Comparator> *this_local;
  
  a = this->head_;
  iVar1 = GetMaxHeight(this);
  next._4_4_ = iVar1 + -1;
  while( true ) {
    pNStack_20 = a;
    bVar2 = true;
    if (pNStack_20 != this->head_) {
      iVar1 = Comparator::operator()((Comparator *)this,&pNStack_20->key,key);
      bVar2 = iVar1 < 0;
    }
    if (!bVar2) break;
    a = Node::Next(pNStack_20,next._4_4_);
    if ((a == (Node *)0x0) ||
       (iVar1 = Comparator::operator()((Comparator *)this,&a->key,key), -1 < iVar1)) {
      if (next._4_4_ == 0) {
        return pNStack_20;
      }
      next._4_4_ = next._4_4_ + -1;
      a = pNStack_20;
    }
  }
  __assert_fail("x == head_ || compare_(x->key, key) < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                ,0x121,
                "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<unsigned long, leveldb::Comparator>::FindLessThan(const Key &) const [Key = unsigned long, Comparator = leveldb::Comparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}